

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O3

void sun_prog_ilopheth(AREA_DATA_conflict *area)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  area_data *local_a0;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (sun == 3) {
    paVar2 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sun_prog_ilopheth","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"zone_echo_queue","");
    CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[66]>
              (&RS.Queue,0xf,&local_58,&local_98,zone_echo_queue,&local_a0,
               (char (*) [66])"The forest grows still, as the night sky settles over the valley.");
    _Var1._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      _Var1._M_p = local_58._M_dataplus._M_p;
    }
  }
  else {
    if (sun != 1) {
      return;
    }
    paVar2 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"sun_prog_ilopheth","");
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"zone_echo_queue","");
    CQueue::AddToQueue<void(*)(area_data*,std::__cxx11::string),area_data*&,char_const(&)[89]>
              (&RS.Queue,0xf,&local_38,&local_78,zone_echo_queue,&local_a0,
               (char (*) [89])
               "With the beginning of the day sounds of life fill the valley, as the forest comes alive."
              );
    _Var1._M_p = local_38._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      _Var1._M_p = local_38._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void sun_prog_ilopheth(AREA_DATA *area)
{
	switch (sun)
	{
		case SolarPosition::Sunrise:
			RS.Queue.AddToQueue(15, "sun_prog_ilopheth", "zone_echo_queue", zone_echo_queue, area, "With the beginning of the day sounds of life fill the valley, as the forest comes alive.");
			break;
		case SolarPosition::Sunset:
			RS.Queue.AddToQueue(15, "sun_prog_ilopheth", "zone_echo_queue", zone_echo_queue, area, "The forest grows still, as the night sky settles over the valley.");
			break;
	}
}